

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O1

Nonnull<std::string_*>
absl::lts_20240722::status_internal::MakeCheckFailString_abi_cxx11_
          (Nonnull<const_absl::Status_*> status,Nonnull<const_char_*> prefix)

{
  AlphaNum *pAVar1;
  StatusToStringMode in_ECX;
  string local_f8;
  AlphaNum local_d8;
  AlphaNum local_a8;
  undefined8 local_78;
  char *local_70;
  AlphaNum local_48;
  
  pAVar1 = (AlphaNum *)operator_new(0x20);
  if (prefix == (Nonnull<const_char_*>)0x0) {
    local_a8.piece_._M_len = 0;
    prefix = (Nonnull<const_char_*>)0x0;
  }
  else {
    local_a8.piece_._M_len = strlen(prefix);
  }
  local_d8.piece_._M_len = 2;
  local_d8.piece_._M_str = " (";
  local_a8.piece_._M_str = prefix;
  if ((Status *)status->rep_ == (Status *)0x1) {
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_f8.field_2._M_allocated_capacity._0_2_ = 0x4b4f;
    local_f8._M_string_length = 2;
    local_f8.field_2._M_local_buf[2] = '\0';
  }
  else {
    Status::ToStringSlow_abi_cxx11_(&local_f8,(Status *)status->rep_,0xffffffff,in_ECX);
  }
  local_48.piece_._M_len = local_f8._M_string_length;
  local_48.piece_._M_str = local_f8._M_dataplus._M_p;
  local_78 = 1;
  local_70 = ")";
  absl::lts_20240722::StrCat_abi_cxx11_(pAVar1,&local_a8,&local_d8,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT53(local_f8.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_f8.field_2._M_local_buf[2],
                                      local_f8.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  return (Nonnull<std::string_*>)pAVar1;
}

Assistant:

absl::Nonnull<std::string*> MakeCheckFailString(
    absl::Nonnull<const absl::Status*> status,
    absl::Nonnull<const char*> prefix) {
  return new std::string(
      absl::StrCat(prefix, " (",
                   status->ToString(StatusToStringMode::kWithEverything), ")"));
}